

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
           *this,element_type *p,arrays_type *arrays_,size_t *num_destroyed)

{
  undefined1 auVar1 [16];
  
  auVar1 = ZEXT416(CONCAT22((p->first).subsystem,(p->first).code)) * ZEXT816(0x9e3779b97f4a7c15);
  nosize_transfer_element(this,p,auVar1._8_8_ ^ auVar1._0_8_,arrays_,num_destroyed);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, const arrays_type& arrays_,
                                 std::size_t& num_destroyed) {
        nosize_transfer_element(p, hash_for(key_from(*p)), arrays_, num_destroyed,
                                std::integral_constant < bool,
                                std::is_nothrow_move_constructible<init_type>::value ||
                                    !std::is_same<element_type, value_type>::value ||
                                    !std::is_copy_constructible<element_type>::value > {});
    }